

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics-graphics.cpp
# Opt level: O0

undefined8 Statistics::Graphics::MessageScoreSavedPrompt_abi_cxx11_(void)

{
  ostream *poVar1;
  undefined8 in_RDI;
  ostringstream local_198 [8];
  ostringstream score_saved_richtext;
  char *sp;
  char *score_saved_text;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"\n");
  poVar1 = Color::operator<<(poVar1,&green);
  poVar1 = Color::operator<<(poVar1,&bold_on);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,"Score saved!");
  poVar1 = Color::operator<<(poVar1,&bold_off);
  poVar1 = Color::operator<<(poVar1,&def);
  std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string MessageScoreSavedPrompt() {
  constexpr auto score_saved_text = "Score saved!";
  constexpr auto sp = "  ";
  std::ostringstream score_saved_richtext;
  score_saved_richtext << "\n"
                       << green << bold_on << sp << score_saved_text << bold_off
                       << def << "\n";
  return score_saved_richtext.str();
}